

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O1

bool nivalis::anon_unknown_0::check_for_cycle
               (vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                *funcs,uint64_t fid)

{
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this;
  pointer pUVar1;
  uint64_t *puVar2;
  bool bVar3;
  size_type sVar4;
  __hashtable *__h;
  uint64_t *puVar5;
  long *in_FS_OFFSET;
  bool bVar6;
  __node_gen_type __node_gen;
  uint64_t local_40;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_38;
  
  local_40 = fid;
  if ((char)in_FS_OFFSET[-0xe] == '\0') {
    _GLOBAL__N_1::check_for_cycle();
  }
  this = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          *)(*in_FS_OFFSET + -0xa8);
  sVar4 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(this,&local_40);
  bVar6 = true;
  if (sVar4 == 0) {
    local_38 = this;
    std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)this,&local_40);
    pUVar1 = (funcs->
             super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar5 = *(uint64_t **)
              &pUVar1[local_40].deps.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
    puVar2 = *(pointer *)
              ((long)&pUVar1[local_40].deps.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8)
    ;
    bVar6 = puVar5 == puVar2;
    if (!bVar6) {
      bVar3 = check_for_cycle(funcs,*puVar5);
      while (!bVar3) {
        puVar5 = puVar5 + 1;
        bVar6 = puVar5 == puVar2;
        if (bVar6) goto LAB_00109c55;
        bVar3 = check_for_cycle(funcs,*puVar5);
      }
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase(this,&local_40);
      if (!bVar6) {
        return true;
      }
    }
LAB_00109c55:
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(this,&local_40);
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool check_for_cycle(const std::vector<Environment::UserFunction>& funcs,
                     uint64_t fid) {
    thread_local std::unordered_set<uint64_t> seen;
    if (seen.count(fid)) return true;
    seen.insert(fid);
    for (uint64_t dep_fid : funcs[fid].deps) {
        if (check_for_cycle(funcs, dep_fid)) {
            seen.erase(fid);
            return true;
        }
    }
    seen.erase(fid);
    return false;
}